

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O3

void __thiscall chrono::ChSystem::SetupInitial(ChSystem *this)

{
  element_type *peVar1;
  
  Eigen::internal::manage_multi_threading(Eigen::Action,int*)::m_maxThreads = this->nthreads_eigen;
  peVar1 = (this->collision_system).
           super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*peVar1->_vptr_ChCollisionSystem[0xd])(peVar1,(ulong)(uint)this->nthreads_collision);
  }
  ChAssembly::SetupInitial(&this->assembly);
  this->is_initialized = true;
  return;
}

Assistant:

void ChSystem::SetupInitial() {
    // Set num threads for Eigen
    Eigen::setNbThreads(nthreads_eigen);

    // Set num threads for the collision system
    if (collision_system) {
        collision_system->SetNumThreads(nthreads_collision);
    }

    assembly.SetupInitial();
    is_initialized = true;
}